

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Security.cpp
# Opt level: O3

bool Security::DontEncode(Opnd *opnd)

{
  byte bVar1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  undefined4 *puVar5;
  long lVar6;
  undefined1 uVar7;
  
  OVar3 = IR::Opnd::GetKind(opnd);
  switch(OVar3) {
  case OpndKindIntConst:
    OVar3 = IR::Opnd::GetKind(opnd);
    if (OVar3 != OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
      if (!bVar4) goto LAB_0062401d;
      *puVar5 = 0;
    }
    uVar7 = *(undefined1 *)&opnd[2].m_valueType.field_0;
    break;
  case OpndKindInt64Const:
    uVar7 = 0;
    break;
  case OpndKindAddr:
    OVar3 = IR::Opnd::GetKind(opnd);
    if (OVar3 != OpndKindAddr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
      if (!bVar4) goto LAB_0062401d;
      *puVar5 = 0;
    }
    uVar7 = 1;
    if ((((ushort)opnd[2].m_valueType.field_0 & 1) == 0) &&
       ((bVar1 = *(byte *)((long)&opnd[2].m_valueType.field_0.bits + 1), bVar1 == 10 || (bVar1 == 1)
        ))) {
      uVar7 = *(short *)((long)&opnd[2]._vptr_Opnd + 6) == 0;
    }
    break;
  case OpndKindIndir:
    OVar3 = IR::Opnd::GetKind(opnd);
    if (OVar3 != OpndKindIndir) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
      if (!bVar4) goto LAB_0062401d;
      *puVar5 = 0;
    }
    uVar7 = 1;
    if (opnd->field_0xe == '\0') {
      uVar7 = *(int *)&opnd[2]._vptr_Opnd == 0;
    }
    break;
  default:
    if (OVar3 == OpndKindList) {
      OVar3 = IR::Opnd::GetKind(opnd);
      if (OVar3 != OpndKindList) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1a4,"(this->IsListOpnd())","Bad call to AsListOpnd()");
        if (!bVar4) goto LAB_0062401d;
        *puVar5 = 0;
      }
      if (*(int *)&opnd[1]._vptr_Opnd < 1) {
        return true;
      }
      lVar6 = 0;
      while (bVar4 = DontEncode(*(Opnd **)(*(long *)&opnd[1].m_valueType + lVar6 * 8)), bVar4) {
        lVar6 = lVar6 + 1;
        if (*(int *)&opnd[1]._vptr_Opnd <= lVar6) {
          return true;
        }
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Security.cpp"
                         ,0x136,
                         "(opnd->AsListOpnd()->All([](IR::ListOpndType* opnd) { return DontEncode(opnd); }))"
                         ,
                         "opnd->AsListOpnd()->All([](IR::ListOpndType* opnd) { return DontEncode(opnd); })"
                        );
      if (bVar4) {
        *puVar5 = 0;
        return true;
      }
LAB_0062401d:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
  case OpndKindFloatConst:
  case OpndKindFloat32Const:
  case OpndKindSimd128Const:
  case OpndKindHelperCall:
  case OpndKindSym:
  case OpndKindReg:
    uVar7 = 1;
  }
  return (bool)uVar7;
}

Assistant:

bool
Security::DontEncode(IR::Opnd *opnd)
{
    switch (opnd->GetKind())
    {
    case IR::OpndKindIntConst:
    {
        IR::IntConstOpnd *intConstOpnd = opnd->AsIntConstOpnd();
        return intConstOpnd->m_dontEncode;
    }

    case IR::OpndKindAddr:
    {
        IR::AddrOpnd *addrOpnd = opnd->AsAddrOpnd();
        return (addrOpnd->m_dontEncode ||
            !addrOpnd->IsVar() ||
            addrOpnd->m_address == nullptr ||
            !Js::TaggedNumber::Is(addrOpnd->m_address));
    }
    case IR::OpndKindIndir:
    {
        IR::IndirOpnd *indirOpnd = opnd->AsIndirOpnd();
        return indirOpnd->m_dontEncode || indirOpnd->GetOffset() == 0;
    }
    case IR::OpndKindInt64Const:
        return false;
    case IR::OpndKindList:
    {
        // We should only have RegOpnd in the ListOpnd therefore, we don't need to encode anything
        Assert(opnd->AsListOpnd()->All([](IR::ListOpndType* opnd) { return DontEncode(opnd); }));
        return true;
    }
    default:
        return true;
    }
}